

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationFastLatinBuilder::addUniqueCE
          (CollationFastLatinBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong elem;
  uint uVar7;
  uint in_R11D;
  
  if ((((int)((ulong)ce >> 0x20) != 1) && (ce != 0)) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    elem = ce & 0xffffffffffff3fff;
    uVar5 = (this->uniqueCEs).count;
    if (uVar5 == 0) {
      in_R11D = 0xffffffff;
    }
    else {
      uVar7 = 0;
      do {
        uVar6 = (int)(uVar5 + uVar7) / 2;
        uVar1 = (this->uniqueCEs).elements[(int)uVar6];
        if (uVar1 == elem) {
LAB_0023145a:
          bVar2 = false;
          uVar3 = uVar7;
          uVar4 = uVar5;
          in_R11D = uVar6;
        }
        else {
          bVar2 = true;
          if (elem < uVar1) {
            uVar3 = uVar7;
            uVar4 = uVar6;
            if (uVar6 == uVar7) {
              uVar6 = ~uVar7;
              goto LAB_0023145a;
            }
          }
          else {
            uVar3 = uVar6;
            uVar4 = uVar5;
            if (uVar6 == uVar7) {
              uVar6 = -uVar7 - 2;
              goto LAB_0023145a;
            }
          }
        }
        uVar5 = uVar4;
        uVar7 = uVar3;
      } while (bVar2);
    }
    if ((int)in_R11D < 0) {
      UVector64::insertElementAt(&this->uniqueCEs,elem,~in_R11D,errorCode);
      return;
    }
  }
  return;
}

Assistant:

void
CollationFastLatinBuilder::addUniqueCE(int64_t ce, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(ce == 0 || (uint32_t)(ce >> 32) == Collation::NO_CE_PRIMARY) { return; }
    ce &= ~(int64_t)Collation::CASE_MASK;  // blank out case bits
    int32_t i = binarySearch(uniqueCEs.getBuffer(), uniqueCEs.size(), ce);
    if(i < 0) {
        uniqueCEs.insertElementAt(ce, ~i, errorCode);
    }
}